

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O3

void cf_hmac_drbg_init(cf_hmac_drbg *ctx,cf_chash *hash,void *entropy,size_t nentropy,void *nonce,
                      size_t nnonce,void *persn,size_t npersn)

{
  ulong __n;
  uint8_t initial_key [64];
  uint8_t local_78 [72];
  
  memset(ctx,0,800);
  __n = hash->hashsz;
  if (__n < 0x41) {
    memset(local_78,0,__n);
    memset(ctx,1,__n);
    cf_hmac_init(&ctx->hmac,hash,local_78,hash->hashsz);
    hmac_drbg_update(ctx,entropy,nentropy,nonce,nnonce,persn,npersn);
    ctx->reseed_counter = 1;
    return;
  }
  abort();
}

Assistant:

void cf_hmac_drbg_init(cf_hmac_drbg *ctx,
                       const cf_chash *hash,
                       const void *entropy, size_t nentropy,
                       const void *nonce, size_t nnonce,
                       const void *persn, size_t npersn)
{
  mem_clean(ctx, sizeof *ctx);

  assert(hash->hashsz <= CF_MAXHASH);

  /* 2. Key = 0x00 00 ... 00
   * 3. V = 0x01 01 ... 01 */
  uint8_t initial_key[CF_MAXHASH];
  memset(initial_key, 0x00, hash->hashsz);
  memset(ctx->V, 0x01, hash->hashsz);
  cf_hmac_init(&ctx->hmac, hash, initial_key, hash->hashsz);

  /* 1. seed_material = entropy_input || nonce || personalization_string
   * 4. (Key, V) = HMAC_DRBG_Update(seed_material, Key, V) */
  hmac_drbg_update(ctx, entropy, nentropy, nonce, nnonce, persn, npersn);

  /* 5. reseed_counter = 1 */
  ctx->reseed_counter = 1;
}